

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallAndroidMKGenerator.cxx
# Opt level: O3

void __thiscall
cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode
          (cmExportInstallAndroidMKGenerator *this,ostream *os,string *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmInstallExportGenerator *pcVar2;
  pointer pcVar3;
  cmExportSet *pcVar4;
  pointer puVar5;
  cmInstallTargetGenerator *pcVar6;
  cmTarget *this_00;
  TargetType TVar7;
  size_t sVar8;
  ostream *poVar9;
  cmTargetExport *pcVar10;
  pointer puVar11;
  long lVar12;
  string dest;
  string path;
  string installDir;
  string local_d0;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  string local_90;
  char *local_70;
  long local_68;
  char local_60;
  undefined7 uStack_5f;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pcVar2 = (this->super_cmExportInstallFileGenerator).IEGen;
  local_50 = local_40;
  pcVar3 = (pcVar2->super_cmInstallGenerator).Destination._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,
             pcVar3 + (pcVar2->super_cmInstallGenerator).Destination._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_PATH := $(call my-dir)\n",0x1d);
  sVar8 = cmsys::SystemTools::CountChar((char *)local_50,'/');
  local_70 = &local_60;
  local_68 = 0;
  local_60 = '\0';
  lVar12 = sVar8 + (local_48 != 0);
  if (lVar12 != 0) {
    do {
      std::__cxx11::string::append((char *)&local_70);
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"_IMPORT_PREFIX := $(LOCAL_PATH)",0x1f);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(os,local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n\n",2);
  pcVar4 = ((this->super_cmExportInstallFileGenerator).IEGen)->ExportSet;
  puVar11 = (pcVar4->TargetExports).
            super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (pcVar4->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar11 != puVar5) {
    paVar1 = &local_90.field_2;
    do {
      TVar7 = cmGeneratorTarget::GetType
                        (((puVar11->_M_t).
                          super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                          .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target);
      if (TVar7 != INTERFACE_LIBRARY) {
        local_b0 = &local_a0;
        local_a8 = 0;
        local_a0 = 0;
        pcVar10 = (puVar11->_M_t).
                  super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                  super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                  super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
        pcVar6 = pcVar10->LibraryGenerator;
        if (pcVar6 != (cmInstallTargetGenerator *)0x0) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
          cmInstallTargetGenerator::GetDestination(&local_90,pcVar6,&local_d0);
          std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          pcVar10 = (puVar11->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
        }
        pcVar6 = pcVar10->ArchiveGenerator;
        if (pcVar6 != (cmInstallTargetGenerator *)0x0) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
          cmInstallTargetGenerator::GetDestination(&local_90,pcVar6,&local_d0);
          std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          pcVar10 = (puVar11->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
        }
        this_00 = pcVar10->Target->Target;
        local_90._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"__dest","");
        cmTarget::SetProperty(this_00,&local_90,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
        }
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar5);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode(
  std::ostream& os, const std::string&)
{
  std::string installDir = this->IEGen->GetDestination();
  os << "LOCAL_PATH := $(call my-dir)\n";
  size_t numDotDot = cmSystemTools::CountChar(installDir.c_str(), '/');
  numDotDot += installDir.empty() ? 0 : 1;
  std::string path;
  for (size_t n = 0; n < numDotDot; n++) {
    path += "/..";
  }
  os << "_IMPORT_PREFIX := $(LOCAL_PATH)" << path << "\n\n";
  for (std::unique_ptr<cmTargetExport> const& te :
       this->IEGen->GetExportSet()->GetTargetExports()) {
    // Collect import properties for this target.
    if (te->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    std::string dest;
    if (te->LibraryGenerator) {
      dest = te->LibraryGenerator->GetDestination("");
    }
    if (te->ArchiveGenerator) {
      dest = te->ArchiveGenerator->GetDestination("");
    }
    te->Target->Target->SetProperty("__dest", dest);
  }
}